

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<double>::Swap
          (RepeatedField<double> *this,RepeatedField<double> *other)

{
  void **ppvVar1;
  void **ppvVar2;
  RepeatedField<double> temp;
  RepeatedField<double> RStack_28;
  
  if (this != other) {
    ppvVar1 = (void **)((long)this->arena_or_elements_ + -8);
    if (this->total_size_ == 0) {
      ppvVar1 = &this->arena_or_elements_;
    }
    ppvVar2 = (void **)((long)other->arena_or_elements_ + -8);
    if (other->total_size_ == 0) {
      ppvVar2 = &other->arena_or_elements_;
    }
    if ((Arena *)*ppvVar1 == (Arena *)*ppvVar2) {
      InternalSwap(this,other);
      return;
    }
    RepeatedField(&RStack_28,(Arena *)*ppvVar2);
    MergeFrom(&RStack_28,this);
    CopyFrom(this,other);
    UnsafeArenaSwap(other,&RStack_28);
    ~RepeatedField(&RStack_28);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArenaNoVirtual());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}